

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
::
initialize<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
          (optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
           *this,Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                 *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                )0x1) {
    tinyusdz::
    Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
    ::Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
             )0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half, 3>>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half, 3>>>, V = tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half, 3>>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }